

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ecmult_constants_2bit(void)

{
  secp256k1_scratch_space *a;
  int k;
  secp256k1_scratch_space *scratch;
  int j;
  int i;
  uchar b32 [32];
  secp256k1_sha256 acc;
  secp256k1_scalar x;
  secp256k1_scratch *in_stack_000004c0;
  secp256k1_scalar *in_stack_000004c8;
  secp256k1_sha256 *in_stack_000004d0;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff50;
  int iVar1;
  undefined1 local_a8 [8];
  secp256k1_scalar *in_stack_ffffffffffffff60;
  secp256k1_scalar *in_stack_ffffffffffffff68;
  secp256k1_scalar *in_stack_ffffffffffffff70;
  secp256k1_sha256 local_88;
  
  a = secp256k1_scratch_space_create
                ((secp256k1_context *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  secp256k1_sha256_initialize(&local_88);
  for (iVar1 = 0; iVar1 < 0x25; iVar1 = iVar1 + 1) {
    secp256k1_scalar_set_int
              ((secp256k1_scalar *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff3c);
    test_ecmult_accumulate(in_stack_000004d0,in_stack_000004c8,in_stack_000004c0);
    secp256k1_scalar_negate
              ((secp256k1_scalar *)CONCAT44(iVar1,in_stack_ffffffffffffff50),(secp256k1_scalar *)a);
    test_ecmult_accumulate(in_stack_000004d0,in_stack_000004c8,in_stack_000004c0);
  }
  for (iVar1 = 0; iVar1 < 0x100; iVar1 = iVar1 + 1) {
    for (in_stack_ffffffffffffff50 = 1; in_stack_ffffffffffffff50 < 0x100;
        in_stack_ffffffffffffff50 = in_stack_ffffffffffffff50 + 2) {
      secp256k1_scalar_set_int
                ((secp256k1_scalar *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c);
      for (in_stack_ffffffffffffff44 = 0; in_stack_ffffffffffffff44 < iVar1;
          in_stack_ffffffffffffff44 = in_stack_ffffffffffffff44 + 1) {
        secp256k1_scalar_add
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      }
      test_ecmult_accumulate(in_stack_000004d0,in_stack_000004c8,in_stack_000004c0);
    }
  }
  secp256k1_sha256_finalize((secp256k1_sha256 *)CONCAT44(iVar1,in_stack_ffffffffffffff50),a->magic);
  iVar1 = secp256k1_memcmp_var(local_a8,test_ecmult_constants_2bit::expected32,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x155d,"test condition failed: secp256k1_memcmp_var(b32, expected32, 32) == 0");
    abort();
  }
  secp256k1_scratch_space_destroy
            ((secp256k1_context *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (secp256k1_scratch_space *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  return;
}

Assistant:

static void test_ecmult_constants_2bit(void) {
    /* Using test_ecmult_accumulate, test ecmult for:
     * - For i in 0..36:
     *   - Key i
     *   - Key -i
     * - For i in 0..255:
     *   - For j in 1..255 (only odd values):
     *     - Key (j*2^i) mod order
     */
    secp256k1_scalar x;
    secp256k1_sha256 acc;
    unsigned char b32[32];
    int i, j;
    secp256k1_scratch_space *scratch = secp256k1_scratch_space_create(CTX, 65536);

    /* Expected hash of all the computed points; created with an independent
     * implementation. */
    static const unsigned char expected32[32] = {
        0xe4, 0x71, 0x1b, 0x4d, 0x14, 0x1e, 0x68, 0x48,
        0xb7, 0xaf, 0x47, 0x2b, 0x4c, 0xd2, 0x04, 0x14,
        0x3a, 0x75, 0x87, 0x60, 0x1a, 0xf9, 0x63, 0x60,
        0xd0, 0xcb, 0x1f, 0xaa, 0x85, 0x9a, 0xb7, 0xb4
    };
    secp256k1_sha256_initialize(&acc);
    for (i = 0; i <= 36; ++i) {
        secp256k1_scalar_set_int(&x, i);
        test_ecmult_accumulate(&acc, &x, scratch);
        secp256k1_scalar_negate(&x, &x);
        test_ecmult_accumulate(&acc, &x, scratch);
    };
    for (i = 0; i < 256; ++i) {
        for (j = 1; j < 256; j += 2) {
            int k;
            secp256k1_scalar_set_int(&x, j);
            for (k = 0; k < i; ++k) secp256k1_scalar_add(&x, &x, &x);
            test_ecmult_accumulate(&acc, &x, scratch);
        }
    }
    secp256k1_sha256_finalize(&acc, b32);
    CHECK(secp256k1_memcmp_var(b32, expected32, 32) == 0);

    secp256k1_scratch_space_destroy(CTX, scratch);
}